

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

wstring * mjs::anon_unknown_2::replace_unicode_escape_sequences
                    (wstring *__return_storage_ptr__,wstring *id,version ver)

{
  bool bVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  runtime_error *prVar6;
  wchar_t *s;
  wstring local_90 [34];
  ushort local_6e;
  char16_t ch;
  wstring local_60 [32];
  ulong local_40;
  size_type last;
  char *default_error_message;
  ulong local_28;
  size_type idx;
  wstring *pwStack_18;
  version ver_local;
  wstring *id_local;
  wstring *res;
  
  idx._4_4_ = ver;
  pwStack_18 = id;
  id_local = __return_storage_ptr__;
  local_28 = std::__cxx11::wstring::find_first_of((wchar_t)id,0x5c);
  if (local_28 == 0xffffffffffffffff) {
    __assert_fail("idx != std::wstring::npos",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0xb8,
                  "std::wstring mjs::(anonymous namespace)::replace_unicode_escape_sequences(const std::wstring &, version)"
                 );
  }
  default_error_message._7_1_ = 0;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  last = (size_type)anon_var_dwarf_133cee;
  local_40 = 0;
  while( true ) {
    if (local_28 == 0xffffffffffffffff) {
      std::__cxx11::wstring::substr((ulong)local_90,(ulong)pwStack_18);
      std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,local_90);
      std::__cxx11::wstring::~wstring(local_90);
      return __return_storage_ptr__;
    }
    piVar3 = (int *)std::__cxx11::wstring::operator[]((ulong)pwStack_18);
    if (*piVar3 != 0x5c) break;
    if (local_28 != local_40) {
      std::__cxx11::wstring::substr((ulong)local_60,(ulong)pwStack_18);
      std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,local_60);
      std::__cxx11::wstring::~wstring(local_60);
    }
    uVar4 = local_28 + 6;
    local_40 = uVar4;
    uVar5 = std::__cxx11::wstring::length();
    if ((uVar5 < uVar4) ||
       ((piVar3 = (int *)std::__cxx11::wstring::operator[]((ulong)pwStack_18), *piVar3 != 0x75 &&
        (piVar3 = (int *)std::__cxx11::wstring::operator[]((ulong)pwStack_18), *piVar3 != 0x55)))) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Illegal unicode escape sequence in identfier");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    s = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)pwStack_18);
    uVar2 = get_hex_value4(s);
    local_6e = (ushort)uVar2;
    bVar1 = is_identifier_part(uVar2 & 0xffff,idx._4_4_);
    if (!bVar1) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Illegal unicode escape sequence in identfier");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(uint)local_6e);
    local_28 = std::__cxx11::wstring::find_first_of((wchar_t)pwStack_18,0x5c);
  }
  __assert_fail("id[idx] == \'\\\\\'",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                0xbd,
                "std::wstring mjs::(anonymous namespace)::replace_unicode_escape_sequences(const std::wstring &, version)"
               );
}

Assistant:

std::wstring replace_unicode_escape_sequences(const std::wstring& id, version ver) {
    auto idx = id.find_first_of(L'\\');
    assert(idx != std::wstring::npos);
    std::wstring res;
    constexpr const char* const default_error_message = "Illegal unicode escape sequence in identfier";
    std::wstring::size_type last = 0;
    while (idx != std::string::npos) {
        assert(id[idx] == '\\');
        if (idx != last) {
            res += id.substr(last, idx - last);
        }

        last = idx + 6;
        if (last > id.length() || (id[idx+1] != 'u' && id[idx+1] != 'U')) {
            throw std::runtime_error(default_error_message);
        }

        const auto ch = static_cast<char16_t>(get_hex_value4(&id[idx+2]));
        if (!is_identifier_part(ch, ver)) {
            throw std::runtime_error(default_error_message);
        }
        res += ch;

        idx = id.find_first_of(L'\\', idx + 1);
    }

    res += id.substr(last);

    return res;
}